

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uchar *puVar9;
  undefined4 uVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [14];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [14];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [13];
  undefined1 auVar24 [14];
  unkbyte10 Var25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  uint6 uVar29;
  undefined8 uVar30;
  int glyph_index;
  stbrp_rect *r;
  stbrp_rect *psVar31;
  int iVar32;
  uint uVar33;
  stbtt_pack_range *psVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  ushort uVar38;
  char cVar41;
  char cVar42;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  short sVar45;
  short sVar46;
  ushort uVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int y0;
  int x0;
  int advance;
  int y1;
  int x1;
  int lsb;
  int local_e4;
  int local_d4;
  int local_d0;
  int local_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  stbtt_pack_range *local_b0;
  stbrp_rect *local_a8;
  ulong local_a0;
  ulong local_98;
  stbtt_pack_context *local_90;
  stbtt_pack_range *local_88;
  stbtt_packedchar *local_80;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_68._0_4_ = spc->h_oversample;
  local_68._4_4_ = spc->v_oversample;
  uStack_60 = 0;
  if (num_ranges < 1) {
    local_e4 = 1;
  }
  else {
    local_a0 = (ulong)(uint)num_ranges;
    local_e4 = 1;
    local_98 = 0;
    iVar36 = 0;
    local_b0 = ranges;
    local_a8 = rects;
    local_90 = spc;
    do {
      local_c8 = ranges[local_98].font_size;
      uStack_c4 = 0;
      uStack_c0 = 0;
      uStack_bc = 0;
      if (local_c8 <= 0.0) {
        uStack_c4 = 0x80000000;
        uStack_c0 = 0x80000000;
        uStack_bc = 0x80000000;
        local_c8 = -local_c8;
        uVar33 = (uint)(ushort)(*(ushort *)(info->data + (long)info->head + 0x12) << 8 |
                               *(ushort *)(info->data + (long)info->head + 0x12) >> 8);
      }
      else {
        puVar9 = info->data;
        lVar35 = (long)info->hhea;
        uVar33 = ((int)(short)((ushort)puVar9[lVar35 + 4] << 8) | (uint)puVar9[lVar35 + 5]) -
                 ((int)(short)((ushort)puVar9[lVar35 + 6] << 8) | (uint)puVar9[lVar35 + 7]);
      }
      local_c8 = local_c8 / (float)(int)uVar33;
      psVar34 = ranges + local_98;
      uVar4._0_1_ = psVar34->h_oversample;
      uVar4._1_1_ = psVar34->v_oversample;
      uVar4._2_6_ = *(undefined6 *)&psVar34->field_0x22;
      auVar11._8_6_ = 0;
      auVar11._0_8_ = uVar4;
      auVar11[0xe] = (char)((uint6)uVar4._2_6_ >> 0x28);
      auVar13._8_4_ = 0;
      auVar13._0_8_ = uVar4;
      auVar13[0xc] = (char)((uint6)uVar4._2_6_ >> 0x20);
      auVar13._13_2_ = auVar11._13_2_;
      auVar14._8_4_ = 0;
      auVar14._0_8_ = uVar4;
      auVar14._12_3_ = auVar13._12_3_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar4;
      auVar15[10] = (char)((uint6)uVar4._2_6_ >> 0x18);
      auVar15._11_4_ = auVar14._11_4_;
      auVar16._8_2_ = 0;
      auVar16._0_8_ = uVar4;
      auVar16._10_5_ = auVar15._10_5_;
      auVar18[8] = (char)((uint6)uVar4._2_6_ >> 0x10);
      auVar18._0_8_ = uVar4;
      auVar18._9_6_ = auVar16._9_6_;
      auVar20._7_8_ = 0;
      auVar20._0_7_ = auVar18._8_7_;
      cVar42 = (char)((uint6)uVar4._2_6_ >> 8);
      Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),cVar42);
      auVar27._9_6_ = 0;
      auVar27._0_9_ = Var21;
      cVar41 = (char)uVar4._2_6_;
      auVar22._1_10_ = SUB1510(auVar27 << 0x30,5);
      auVar22[0] = cVar41;
      auVar28._11_4_ = 0;
      auVar28._0_11_ = auVar22;
      auVar23._1_12_ = SUB1512(auVar28 << 0x20,3);
      auVar23[0] = uVar4._1_1_;
      uVar38 = CONCAT11(0,(undefined1)uVar4);
      auVar19._2_13_ = auVar23;
      auVar19._0_2_ = uVar38;
      uVar47 = (ushort)Var21;
      auVar12._10_2_ = 0;
      auVar12._0_10_ = auVar19._0_10_;
      auVar12._12_2_ = uVar47;
      sVar46 = auVar22._0_2_;
      uVar29 = CONCAT42(auVar12._10_4_,sVar46);
      auVar24._6_8_ = 0;
      auVar24._0_6_ = uVar29;
      sVar45 = auVar23._0_2_;
      Var25 = CONCAT82(SUB148(auVar24 << 0x40,6),sVar45);
      auVar17._4_10_ = Var25;
      auVar17._0_4_ = CONCAT22(0,uVar38);
      spc->h_oversample = (int)auVar17._0_8_;
      spc->v_oversample = (int)((ulong)auVar17._0_8_ >> 0x20);
      iVar32 = psVar34->num_chars;
      if (0 < iVar32) {
        auVar43._0_4_ = (float)CONCAT22(0,uVar38);
        auVar43._4_4_ = (float)(int)Var25;
        auVar43._8_4_ = (float)(int)uVar29;
        auVar43._12_4_ = (float)uVar47;
        local_58 = divps(_DAT_00172190,auVar43);
        auVar50[0] = -((undefined1)uVar4 == 0);
        auVar50[1] = -((undefined1)uVar4 == 0);
        auVar50[2] = -((undefined1)uVar4 == 0);
        auVar50[3] = -((undefined1)uVar4 == 0);
        auVar50[4] = -(uVar4._1_1_ == '\0');
        auVar50[5] = -(uVar4._1_1_ == '\0');
        auVar50[6] = -(uVar4._1_1_ == '\0');
        auVar50[7] = -(uVar4._1_1_ == '\0');
        auVar50[8] = -(cVar41 == '\0');
        auVar50[9] = -(cVar41 == '\0');
        auVar50[10] = -(cVar41 == '\0');
        auVar50[0xb] = -(cVar41 == '\0');
        auVar50[0xc] = -(cVar42 == '\0');
        auVar50[0xd] = -(cVar42 == '\0');
        auVar50[0xe] = -(cVar42 == '\0');
        auVar50[0xf] = -(cVar42 == '\0');
        auVar39._12_2_ = uVar47;
        auVar39._0_12_ = auVar19._0_12_;
        auVar39._14_2_ = -uVar47;
        auVar49._12_4_ = auVar39._12_4_;
        auVar49._10_2_ = -sVar46;
        auVar49._0_10_ = auVar19._0_10_;
        uVar30 = CONCAT62(auVar49._10_6_,sVar46);
        auVar26._4_8_ = uVar30;
        auVar26._2_2_ = 1 - sVar45;
        auVar26._0_2_ = sVar45;
        auVar40._0_4_ = (float)(int)(short)(1 - uVar38);
        auVar40._4_4_ = (float)(auVar26._0_4_ >> 0x10);
        auVar40._8_4_ = (float)((int)uVar30 >> 0x10);
        auVar40._12_4_ = (float)(auVar49._12_4_ >> 0x10);
        auVar44._0_4_ = auVar43._0_4_ + auVar43._0_4_;
        auVar44._4_4_ = auVar43._4_4_ + auVar43._4_4_;
        auVar44._8_4_ = auVar43._8_4_ + auVar43._8_4_;
        auVar44._12_4_ = auVar43._12_4_ + auVar43._12_4_;
        local_48 = divps(auVar40,auVar44);
        local_48 = ~auVar50 & local_48;
        psVar31 = local_a8 + iVar36;
        lVar35 = 0;
        lVar37 = 0;
        local_88 = psVar34;
        do {
          if (psVar31->was_packed == 0) {
            local_e4 = 0;
          }
          else {
            if (psVar34->array_of_unicode_codepoints == (int *)0x0) {
              iVar32 = psVar34->first_unicode_codepoint_in_range + (int)lVar37;
            }
            else {
              iVar32 = psVar34->array_of_unicode_codepoints[lVar37];
            }
            local_80 = psVar34->chardata_for_range;
            glyph_index = stbtt_FindGlyphIndex(info,iVar32);
            spc = local_90;
            uVar1 = psVar31->x;
            uVar5 = psVar31->y;
            iVar32 = local_90->padding;
            psVar31->x = uVar1 + iVar32;
            psVar31->y = uVar5 + iVar32;
            uVar2 = psVar31->w;
            uVar6 = psVar31->h;
            psVar31->w = uVar2 - iVar32;
            psVar31->h = uVar6 - iVar32;
            stbtt_GetGlyphHMetrics(info,glyph_index,&local_cc,&local_6c);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (info,glyph_index,(float)spc->h_oversample * local_c8,
                       (float)spc->v_oversample * local_c8,0.0,0.0,&local_d0,&local_d4,&local_70,
                       &local_74);
            stbtt_MakeGlyphBitmapSubpixel
                      (info,spc->pixels +
                            (long)psVar31->y * (long)spc->stride_in_bytes + (long)psVar31->x,
                       (psVar31->w - spc->h_oversample) + 1,(psVar31->h - spc->v_oversample) + 1,
                       spc->stride_in_bytes,(float)spc->h_oversample * local_c8,
                       (float)spc->v_oversample * local_c8,0.0,0.0,glyph_index);
            if (1 < spc->h_oversample) {
              stbtt__h_prefilter(spc->pixels +
                                 (long)psVar31->y * (long)spc->stride_in_bytes + (long)psVar31->x,
                                 psVar31->w,psVar31->h,spc->stride_in_bytes,spc->h_oversample);
            }
            if (1 < spc->v_oversample) {
              stbtt__v_prefilter(spc->pixels +
                                 (long)psVar31->y * (long)spc->stride_in_bytes + (long)psVar31->x,
                                 psVar31->w,psVar31->h,spc->stride_in_bytes,spc->v_oversample);
            }
            *(float *)((long)&local_80->xadvance + lVar35) = (float)local_cc * local_c8;
            *(ulong *)((long)&local_80->xoff + lVar35) =
                 CONCAT44((float)local_d4 * (float)local_58._4_4_ + local_48._4_4_,
                          (float)local_d0 * (float)local_58._0_4_ + local_48._0_4_);
            uVar3 = psVar31->w;
            uVar7 = psVar31->h;
            uVar8 = psVar31->x;
            uVar10 = psVar31->y;
            *(short *)((long)&local_80->x0 + lVar35) = (short)uVar8;
            *(short *)((long)&local_80->y0 + lVar35) = (short)uVar10;
            auVar48._0_4_ = uVar8 + uVar3;
            auVar48._4_4_ = uVar10 + uVar7;
            auVar48._8_8_ = 0;
            auVar49 = pshuflw(auVar48,auVar48,0xe8);
            *(int *)((long)&local_80->x1 + lVar35) = auVar49._0_4_;
            *(ulong *)((long)&local_80->xoff2 + lVar35) =
                 CONCAT44((float)(local_d4 + uVar7) * (float)local_58._4_4_ + local_48._4_4_,
                          (float)(local_d0 + uVar3) * (float)local_58._0_4_ + local_48._0_4_);
            iVar32 = local_88->num_chars;
            psVar34 = local_88;
          }
          lVar37 = lVar37 + 1;
          psVar31 = psVar31 + 1;
          lVar35 = lVar35 + 0x1c;
        } while (lVar37 < iVar32);
        iVar36 = iVar36 + (int)lVar37;
        ranges = local_b0;
      }
      local_98 = local_98 + 1;
    } while (local_98 != local_a0);
  }
  spc->h_oversample = (undefined4)local_68;
  spc->v_oversample = local_68._4_4_;
  return local_e4;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k, return_value = 1;

   // save current values
   int old_h_over = spc->h_oversample;
   int old_v_over = spc->v_oversample;

   k = 0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      float recip_h,recip_v,sub_x,sub_y;
      spc->h_oversample = ranges[i].h_oversample;
      spc->v_oversample = ranges[i].v_oversample;
      recip_h = 1.0f / spc->h_oversample;
      recip_v = 1.0f / spc->v_oversample;
      sub_x = stbtt__oversample_shift(spc->h_oversample);
      sub_y = stbtt__oversample_shift(spc->v_oversample);
      for (j=0; j < ranges[i].num_chars; ++j) {
         stbrp_rect *r = &rects[k];
         if (r->was_packed) {
            stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
            int advance, lsb, x0,y0,x1,y1;
            int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
            int glyph = stbtt_FindGlyphIndex(info, codepoint);
            stbrp_coord pad = (stbrp_coord) spc->padding;

            // pad on left and top
            r->x += pad;
            r->y += pad;
            r->w -= pad;
            r->h -= pad;
            stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
            stbtt_GetGlyphBitmapBox(info, glyph,
                                    scale * spc->h_oversample,
                                    scale * spc->v_oversample,
                                    &x0,&y0,&x1,&y1);
            stbtt_MakeGlyphBitmapSubpixel(info,
                                          spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                          r->w - spc->h_oversample+1,
                                          r->h - spc->v_oversample+1,
                                          spc->stride_in_bytes,
                                          scale * spc->h_oversample,
                                          scale * spc->v_oversample,
                                          0,0,
                                          glyph);

            if (spc->h_oversample > 1)
               stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->h_oversample);

            if (spc->v_oversample > 1)
               stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->v_oversample);

            bc->x0       = (stbtt_int16)  r->x;
            bc->y0       = (stbtt_int16)  r->y;
            bc->x1       = (stbtt_int16) (r->x + r->w);
            bc->y1       = (stbtt_int16) (r->y + r->h);
            bc->xadvance =                scale * advance;
            bc->xoff     =       (float)  x0 * recip_h + sub_x;
            bc->yoff     =       (float)  y0 * recip_v + sub_y;
            bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
            bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;
         } else {
            return_value = 0; // if any fail, report failure
         }

         ++k;
      }
   }

   // restore original values
   spc->h_oversample = old_h_over;
   spc->v_oversample = old_v_over;

   return return_value;
}